

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O0

void com_pic_free(com_pic_param_t *pic_param,com_pic_t *pic)

{
  com_pic_t *pic_local;
  com_pic_param_t *pic_param_local;
  
  if (pic != (com_pic_t *)0x0) {
    if (pic->parallel_enable != 0) {
      pthread_mutex_destroy((pthread_mutex_t *)&pic->mutex);
      pthread_cond_destroy((pthread_cond_t *)&pic->cond);
    }
    if (pic->mem_base != (void *)0x0) {
      align_free(pic->mem_base);
      pic->mem_base = (void *)0x0;
    }
    if (pic != (com_pic_t *)0x0) {
      align_free(pic);
    }
  }
  return;
}

Assistant:

void com_pic_free(com_pic_param_t *pic_param, com_pic_t *pic)
{
    if (pic) {
        if (pic->parallel_enable) {
            uavs3d_pthread_mutex_destroy(&pic->mutex);
            uavs3d_pthread_cond_destroy(&pic->cond);
        }
        com_free(pic->mem_base);
        com_free(pic);
    }
}